

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

void http_buf_pull_up(nni_http_conn *conn)

{
  size_t sVar1;
  
  sVar1 = conn->rd_get;
  if (sVar1 != 0) {
    memmove(conn->buf,conn->buf + sVar1,conn->rd_put - sVar1);
    conn->rd_put = conn->rd_put - conn->rd_get;
    conn->rd_get = 0;
  }
  return;
}

Assistant:

static void
http_buf_pull_up(nni_http_conn *conn)
{
	if (conn->rd_get != 0) {
		memmove(conn->buf, conn->buf + conn->rd_get,
		    conn->rd_put - conn->rd_get);
		conn->rd_put -= conn->rd_get;
		conn->rd_get = 0;
	}
}